

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O1

void __thiscall
QPDFObject::setChildDescription
          (QPDFObject *this,QPDF *a_qpdf,shared_ptr<QPDFObject> *parent,string_view *static_descr,
          string *var_descr)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  shared_ptr<QPDFObject> local_88;
  string local_78;
  ChildDescr local_58;
  
  local_88.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (parent->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (parent->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_88.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pcVar3 = (var_descr->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + var_descr->_M_string_length);
  ChildDescr::ChildDescr(&local_58,&local_88,static_descr,&local_78);
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f1bd8;
  paVar2 = &local_58.var_descr.field_2;
  p_Var5[1]._vptr__Sp_counted_base =
       (_func_int **)local_58.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var5[1]._M_use_count =
       local_58.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_58.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)local_58.static_descr;
  *(_Atomic_word **)&p_Var5[2]._M_use_count = &p_Var5[3]._M_use_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.var_descr._M_dataplus._M_p == paVar2) {
    p_Var5[3]._M_use_count =
         (int)CONCAT71(local_58.var_descr.field_2._M_allocated_capacity._1_7_,
                       local_58.var_descr.field_2._M_local_buf[0]);
    p_Var5[3]._M_weak_count = (int)((uint7)local_58.var_descr.field_2._1_7_ >> 0x18);
    p_Var5[4]._vptr__Sp_counted_base = (_func_int **)local_58.var_descr.field_2._8_8_;
  }
  else {
    *(pointer *)&p_Var5[2]._M_use_count = local_58.var_descr._M_dataplus._M_p;
    p_Var5[3]._M_use_count =
         (int)CONCAT71(local_58.var_descr.field_2._M_allocated_capacity._1_7_,
                       local_58.var_descr.field_2._M_local_buf[0]);
    p_Var5[3]._M_weak_count = (int)((uint7)local_58.var_descr.field_2._1_7_ >> 0x18);
  }
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)local_58.var_descr._M_string_length;
  local_58.var_descr._M_string_length = 0;
  local_58.var_descr.field_2._M_local_buf[0] = '\0';
  *(undefined1 *)&p_Var5[4]._M_use_count = 2;
  (this->object_description).
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var5 + 1);
  this_00 = (this->object_description).
            super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->object_description).
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var5;
  local_58.var_descr._M_dataplus._M_p = (pointer)paVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.var_descr._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.var_descr._M_dataplus._M_p,
                    CONCAT71(local_58.var_descr.field_2._M_allocated_capacity._1_7_,
                             local_58.var_descr.field_2._M_local_buf[0]) + 1);
  }
  if (local_58.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_58.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = (local_58.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_58.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*(local_58.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[3])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_88.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  this->qpdf = a_qpdf;
  return;
}

Assistant:

void
    setChildDescription(
        QPDF* a_qpdf,
        std::shared_ptr<QPDFObject> parent,
        std::string_view const& static_descr,
        std::string var_descr)
    {
        object_description =
            std::make_shared<Description>(ChildDescr(parent, static_descr, var_descr));
        qpdf = a_qpdf;
    }